

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status
parse_userinfo_and_at(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  size_t initialOffset;
  curi_status status;
  size_t userinfoEndOffset;
  size_t userinfoStartOffset;
  void *userData_local;
  curi_settings *settings_local;
  size_t *offset_local;
  size_t len_local;
  char *uri_local;
  
  sVar1 = *offset;
  initialOffset._4_4_ = curi_status_success;
  while (initialOffset._4_4_ == curi_status_success) {
    sVar2 = *offset;
    pcVar3 = read_char(uri,len,offset);
    switch(*pcVar3) {
    case '!':
    case '$':
    case '&':
    case '\'':
    case '(':
    case ')':
    case '*':
    case '+':
    case ',':
    case ':':
    case ';':
    case '=':
      break;
    default:
      initialOffset._4_4_ = curi_status_error;
      break;
    case '%':
      initialOffset._4_4_ = parse_h8(uri,len,offset,settings,userData);
      break;
    case '-':
    case '.':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
    case 'A':
    case 'B':
    case 'C':
    case 'D':
    case 'E':
    case 'F':
    case 'G':
    case 'H':
    case 'I':
    case 'J':
    case 'K':
    case 'L':
    case 'M':
    case 'N':
    case 'O':
    case 'P':
    case 'Q':
    case 'R':
    case 'S':
    case 'T':
    case 'U':
    case 'V':
    case 'W':
    case 'X':
    case 'Y':
    case 'Z':
    case '_':
    case 'a':
    case 'b':
    case 'c':
    case 'd':
    case 'e':
    case 'f':
    case 'g':
    case 'h':
    case 'i':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
    case 'r':
    case 's':
    case 't':
    case 'u':
    case 'v':
    case 'w':
    case 'x':
    case 'y':
    case 'z':
    case '~':
    }
    if (initialOffset._4_4_ == curi_status_error) {
      *offset = sVar2;
    }
  }
  sVar2 = *offset;
  initialOffset._4_4_ = parse_char('@',uri,len,offset,settings,userData);
  if (initialOffset._4_4_ == curi_status_success) {
    initialOffset._4_4_ = handle_userinfo(uri + sVar1,sVar2 - sVar1,settings,userData);
  }
  return initialOffset._4_4_;
}

Assistant:

static curi_status parse_userinfo_and_at(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // userinfo_and_at = userinfo "@"
    // userinfo = *( unreserved / "%" h8 / sub-delims / ":" )
    const size_t userinfoStartOffset = *offset;
    size_t userinfoEndOffset;
    curi_status status = curi_status_success;

    while (status == curi_status_success)
    {
        size_t initialOffset = *offset;
        switch (*read_char(uri,len,offset))
        {
            CASE_UNRESERVED:
                break;
            case '%':
                status = parse_h8(uri, len, offset, settings, userData);
                break;
            CASE_SUB_DELIMS:
            case ':':
                break;
            default:
                status = curi_status_error;
        }
        if (status == curi_status_error)
            *offset = initialOffset;
    }

    userinfoEndOffset = *offset;

    status = parse_char('@', uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = handle_userinfo(uri + userinfoStartOffset, userinfoEndOffset - userinfoStartOffset, settings, userData);

    return status;
}